

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeHFE.cpp
# Opt level: O3

int __thiscall
FormatTypeHFE::LoadDisk
          (FormatTypeHFE *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  IDisk *this_00;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  long lVar12;
  MFMTrack *pMVar13;
  uchar *puVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  size_t __n;
  uchar buf [512];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  iVar16 = -1;
  if (*(long *)buffer == 0x4546434950435848) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[9];
    bVar10 = buffer[10];
    this_00->nb_sides_ = bVar10;
    if (bVar10 != 0) {
      lVar12 = 0;
      do {
        *(uint *)((long)&this_00->side_[0].nb_tracks + lVar12) = (uint)bVar1;
        pvVar4 = operator_new__((ulong)bVar1 << 5);
        *(void **)((long)&this_00->side_[0].tracks + lVar12) = pvVar4;
        memset(pvVar4,0,(ulong)bVar1 << 5);
        lVar12 = lVar12 + 0x10;
      } while ((ulong)bVar10 * 0x10 != lVar12);
    }
    pvVar4 = operator_new__((ulong)((uint)bVar1 * 4));
    memcpy(pvVar4,buffer + 0x200,(ulong)((uint)bVar1 * 4));
    if (bVar1 != 0) {
      uVar9 = 0;
      do {
        uVar2 = *(ushort *)((long)pvVar4 + uVar9 * 4);
        uVar3 = *(ushort *)((long)pvVar4 + uVar9 * 4 + 2);
        uVar15 = (ulong)(uVar3 >> 1);
        pvVar5 = operator_new__(uVar15);
        pvVar6 = operator_new__(uVar15);
        if (1 < uVar3) {
          puVar14 = buffer + (ulong)uVar2 * 0x200;
          iVar16 = 0;
          do {
            memcpy(local_238,puVar14,0x200);
            uVar11 = (uint)uVar15;
            __n = 0x100;
            if (uVar11 < 0x100) {
              __n = uVar15;
            }
            memcpy((void *)((long)pvVar5 + (long)iVar16),local_238,__n);
            memcpy((void *)((long)pvVar6 + (long)iVar16),local_138,__n);
            iVar17 = (int)__n;
            iVar16 = iVar16 + iVar17;
            puVar14 = puVar14 + 0x200;
            uVar15 = (ulong)(uVar11 - iVar17);
          } while (uVar11 - iVar17 != 0 && iVar17 <= (int)uVar11);
        }
        bVar10 = this_00->nb_sides_;
        if (bVar10 != 0) {
          uVar15 = 0;
          do {
            pMVar13 = this_00->side_[uVar15].tracks;
            pMVar13[uVar9].size = (uint)((ulong)uVar3 << 2);
            puVar14 = (uchar *)operator_new__((ulong)uVar3 << 2);
            pMVar13[uVar9].bitfield = puVar14;
            if (pMVar13[uVar9].size != 0) {
              pvVar7 = pvVar6;
              if (uVar15 == 0) {
                pvVar7 = pvVar5;
              }
              uVar8 = 0;
              do {
                pMVar13[uVar9].bitfield[uVar8] =
                     (*(byte *)((long)pvVar7 + (uVar8 >> 3)) >> ((uint)uVar8 & 7) & 1) != 0;
                uVar8 = uVar8 + 1;
                pMVar13 = this_00->side_[uVar15].tracks;
              } while (uVar8 < pMVar13[uVar9].size);
              bVar10 = this_00->nb_sides_;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < bVar10);
        }
        operator_delete__(pvVar5);
        operator_delete__(pvVar6);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)bVar1);
    }
    operator_delete__(pvVar4);
    *created_disk = this_00;
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int FormatTypeHFE::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "HXCPICFE", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Header
      int index_buffer = 0;

      Picfileformatheader header;
      //fread(&header, 1, sizeof(header), file);
      memcpy(&header, buffer, sizeof(header));
      index_buffer += sizeof(header);

      // Number of sides
      new_disk->nb_sides_ = header.number_of_side;

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].nb_tracks = header.number_of_track;
         new_disk->side_[side].tracks = new IDisk::MFMTrack[new_disk->side_[side].nb_tracks];
         memset(new_disk->side_[side].tracks, 0, sizeof(IDisk::MFMTrack) * new_disk->side_[side].nb_tracks);
      }

      //fseek(file, 0x200, SEEK_SET);
      index_buffer = 0x200;

      Pictrack* pck_trk = new Pictrack[header.number_of_track];
      //fread(pck_trk, 1, sizeof(pck_trk) * header.number_of_track, file);
      memcpy(pck_trk, &buffer[index_buffer], sizeof(Pictrack) * header.number_of_track);
      index_buffer += sizeof(pck_trk) * header.number_of_track;

      // Second part : (up to 1024 bytes) : Track offset LUT
      unsigned char* buffer1;
      unsigned char* buffer2;
      for (int track = 0; track < header.number_of_track; track++)
      {
         // Track data
         //fseek(file, 0x200 * pck_trk[track].offset, SEEK_SET);
         index_buffer = 0x200 * pck_trk[track].offset;

         // Read bytes
         buffer1 = new unsigned char[pck_trk[track].track_len / 2];
         buffer2 = new unsigned char[pck_trk[track].track_len / 2];

         int byte_to_read = pck_trk[track].track_len / 2;
         unsigned char buf[0x200];
         int index = 0;
         while (byte_to_read > 0)
         {
            //fread(buf, 1, 0x200, file);
            memcpy(buf, &buffer[index_buffer], 0x200);
            index_buffer += 0x200;

            unsigned int cnt = (byte_to_read < 0x100) ? byte_to_read : 0x100;

            memcpy(&buffer1[index], buf, cnt);
            memcpy(&buffer2[index], &buf[0x100], cnt);

            byte_to_read -= cnt;
            index += cnt;
         }


         for (int side = 0; side < new_disk->nb_sides_; side++)
         {
            new_disk->side_[side].tracks[track].size = pck_trk[track].track_len * 4;
            new_disk->side_[side].tracks[track].bitfield = new unsigned char[new_disk->side_[side].
               tracks[track].size];

            // TODO : Multiple side
            for (unsigned int i = 0; i < new_disk->side_[side].tracks[track].size; i++)
            {
               new_disk->side_[side].tracks[track].bitfield[i] = (((side == 0) ? buffer1 : buffer2)[
                  i >> 3]) >> ((i & 7)) & 1;
            }
         }
         delete[]buffer1;
         delete[]buffer2;
      }

      delete[]pck_trk;

      created_disk = new_disk;
      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}